

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O0

laszip_I32 laszip_destroy(laszip_POINTER pointer)

{
  int err;
  laszip_dll_struct *laszip_dll;
  laszip_POINTER pointer_local;
  
  if (pointer == (laszip_POINTER)0x0) {
    pointer_local._4_4_ = 1;
  }
  else {
    pointer_local._4_4_ = laszip_clean(pointer);
    if (pointer != (laszip_POINTER)0x0) {
      ::laszip_dll::~laszip_dll((laszip_dll *)pointer);
      operator_delete(pointer);
    }
  }
  return pointer_local._4_4_;
}

Assistant:

LASZIP_API laszip_I32
laszip_destroy(
    laszip_POINTER                     pointer
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  int err = 0;

  try
  {
    err = laszip_clean(laszip_dll);
    delete laszip_dll;
  }
  catch (...)
  {
    return 1;
  }

  return err;
}